

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestCase.cpp
# Opt level: O3

void __thiscall tcu::TestCase::~TestCase(TestCase *this)

{
  pointer ppTVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  (this->super_TestNode)._vptr_TestNode = (_func_int **)&PTR__TestCase_002744b8;
  TestNode::deinit(&this->super_TestNode);
  ppTVar1 = (this->super_TestNode).m_children.
            super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppTVar1 != (pointer)0x0) {
    operator_delete(ppTVar1,(long)(this->super_TestNode).m_children.
                                  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar1
                   );
  }
  pcVar2 = (this->super_TestNode).m_description._M_dataplus._M_p;
  paVar3 = &(this->super_TestNode).m_description.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_TestNode).m_name._M_dataplus._M_p;
  paVar3 = &(this->super_TestNode).m_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

TestNode::~TestNode (void)
{
	TestNode::deinit();
}